

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O1

void __thiscall
glcts::ArraysOfArrays::ExpressionsIndexingScalar2<glcts::ArraysOfArrays::Interface::ES>::
test_shader_compilation
          (ExpressionsIndexingScalar2<glcts::ArraysOfArrays::Interface::ES> *this,
          TestShaderType tested_shader_type)

{
  TestError *this_00;
  int sub_script_index;
  int iVar1;
  bool bVar2;
  string base_shader_string;
  string shader_source;
  undefined1 *local_a0;
  long local_98;
  undefined1 local_90 [16];
  ExpressionsIndexingScalar2<glcts::ArraysOfArrays::Interface::ES> *local_80;
  ulong local_78;
  undefined1 *local_70;
  undefined8 local_68;
  undefined1 local_60 [16];
  long *local_50 [2];
  long local_40 [2];
  
  local_a0 = local_90;
  local_98 = 0;
  local_90[0] = 0;
  local_70 = local_60;
  local_68 = 0;
  local_60[0] = 0;
  local_80 = this;
  std::__cxx11::string::_M_replace((ulong)&local_a0,0,(char *)0x0,0x1b1d9a5);
  std::__cxx11::string::append((char *)&local_a0);
  std::__cxx11::string::_M_append((char *)&local_a0,shader_start_abi_cxx11_);
  local_78 = (ulong)tested_shader_type;
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char*>((string *)local_50,local_a0,local_a0 + local_98);
  std::__cxx11::string::append((char *)local_50);
  std::__cxx11::string::operator=((string *)&local_70,(string *)local_50);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  iVar1 = 3;
  do {
    std::__cxx11::string::append((char *)&local_70);
    bVar2 = iVar1 != 0;
    iVar1 = iVar1 + -1;
  } while (bVar2);
  std::__cxx11::string::append((char *)&local_70);
  if (tested_shader_type < SHADER_TYPE_LAST) {
    (*(code *)(&DAT_01b174e0 + *(int *)(&DAT_01b174e0 + local_78 * 4)))();
    return;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Unrecognized shader type.",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
             ,0xbec);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void ExpressionsIndexingScalar2<API>::test_shader_compilation(
	typename TestCaseBase<API>::TestShaderType tested_shader_type)
{
	std::string base_shader_string, shader_source;

	// This test tests arrays with 4 dimensions, e.g. x[1][1][1][1]
	const int test_array_dimensions = 4;

	base_shader_string = "float a[1][2][3][4];\n";
	base_shader_string += "float b = 2.0;\n\n";
	base_shader_string += shader_start;

	// There are 16 permutations, so loop 4x4 times.
	for (int permutation = 0; permutation < (1 << test_array_dimensions); permutation++)
	{
		shader_source = base_shader_string + "    a"; // a var called 'a'

		for (int sub_script_index = test_array_dimensions - 1; sub_script_index >= 0; sub_script_index--)
		{
			/* If any bit is set for a particular number then add
			 * a valid array sub_script at that place, otherwise
			 * add an invalid array sub_script. */
			if (permutation & (1 << sub_script_index))
			{
				shader_source += "[0]";
			}
			else
			{
				shader_source += "[-1]";
			}
		}

		shader_source += " = b;\n";

		if (permutation != (1 << test_array_dimensions) - 1)
		{
			/* End main */
			DEFAULT_MAIN_ENDING(tested_shader_type, shader_source);

			/* Execute test */
			this->execute_negative_test(tested_shader_type, shader_source);
		} /* if (permutation != (1 << test_array_dimensions) - 1) */
	}	 /* for (int permutation = 0; ...) */
}